

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_t *p_j2k)

{
  opj_tccp_t *poVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  opj_tcp_t *poVar4;
  opj_tccp_t *poVar5;
  undefined8 uVar6;
  opj_tccp_info_t *poVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  OPJ_PROG_ORDER OVar10;
  uint uVar11;
  opj_codestream_info_v2_t *poVar12;
  opj_tccp_info_t *poVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  opj_codestream_info_v2_t *cstr_info;
  
  uVar2 = p_j2k->m_private_image->numcomps;
  poVar12 = (opj_codestream_info_v2_t *)opj_calloc(1,0x48);
  if (poVar12 != (opj_codestream_info_v2_t *)0x0) {
    uVar11 = p_j2k->m_private_image->numcomps;
    poVar12->nbcomps = uVar11;
    OVar3 = (p_j2k->m_cp).ty0;
    OVar8 = (p_j2k->m_cp).tdx;
    OVar9 = (p_j2k->m_cp).tdy;
    poVar12->tx0 = (p_j2k->m_cp).tx0;
    poVar12->ty0 = OVar3;
    poVar12->tdx = OVar8;
    poVar12->tdy = OVar9;
    OVar3 = (p_j2k->m_cp).th;
    poVar12->tw = (p_j2k->m_cp).tw;
    poVar12->th = OVar3;
    poVar12->tile_info = (opj_tile_info_v2_t *)0x0;
    poVar4 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    OVar10 = poVar4->prg;
    (poVar12->m_default_tile_info).csty = poVar4->csty;
    (poVar12->m_default_tile_info).prg = OVar10;
    (poVar12->m_default_tile_info).numlayers = poVar4->numlayers;
    (poVar12->m_default_tile_info).mct = poVar4->mct;
    cstr_info = poVar12;
    poVar13 = (opj_tccp_info_t *)opj_calloc((ulong)uVar11,0x438);
    (poVar12->m_default_tile_info).tccp_info = poVar13;
    if (poVar13 != (opj_tccp_info_t *)0x0) {
      lVar16 = 0x1a4;
      lVar17 = 0x20;
      uVar18 = 0;
      do {
        if (uVar18 == uVar2) {
          return poVar12;
        }
        poVar5 = poVar4->tccps;
        poVar13 = (poVar12->m_default_tile_info).tccp_info;
        poVar1 = poVar5 + uVar18;
        OVar3 = poVar1->numresolutions;
        uVar6 = *(undefined8 *)&poVar1->cblkw;
        uVar11 = poVar5[uVar18].numresolutions;
        poVar7 = poVar13 + uVar18;
        poVar7->csty = poVar1->csty;
        poVar7->numresolutions = OVar3;
        *(undefined8 *)(&poVar7->csty + 2) = uVar6;
        OVar3 = poVar5[uVar18].qmfbid;
        poVar13[uVar18].cblksty = poVar5[uVar18].cblksty;
        poVar13[uVar18].qmfbid = OVar3;
        if (uVar11 < 0x21) {
          memcpy(poVar13[uVar18].prch,poVar5[uVar18].prch,(ulong)uVar11);
          memcpy(poVar13[uVar18].prcw,poVar5[uVar18].prcw,(ulong)poVar5[uVar18].numresolutions);
        }
        OVar3 = poVar5[uVar18].qntsty;
        poVar13[uVar18].qntsty = OVar3;
        poVar13[uVar18].numgbits = poVar5[uVar18].numgbits;
        uVar11 = 1;
        if (OVar3 == 1) {
LAB_0010e0c3:
          uVar14 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar14 = 0;
          }
          for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
            *(undefined4 *)((long)poVar13 + uVar15 * 4 + lVar16 + -0x184) =
                 *(undefined4 *)((long)poVar5->stepsizes + uVar15 * 8 + lVar17 + -0x1c);
            *(undefined4 *)((long)poVar13->stepsizes_mant + uVar15 * 4 + lVar16 + -0x20) =
                 *(undefined4 *)((long)&poVar5->stepsizes[uVar15 - 4].expn + lVar17);
          }
        }
        else if ((int)poVar5[uVar18].numresolutions < 0x21) {
          uVar11 = poVar5[uVar18].numresolutions * 3 - 2;
          goto LAB_0010e0c3;
        }
        poVar13[uVar18].roishift = poVar5[uVar18].roishift;
        uVar18 = uVar18 + 1;
        lVar16 = lVar16 + 0x438;
        lVar17 = lVar17 + 0x438;
      } while( true );
    }
    opj_destroy_cstr_info(&cstr_info);
  }
  return (opj_codestream_info_v2_t *)0x0;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_t* p_j2k)
{
        OPJ_UINT32 compno;
        OPJ_UINT32 numcomps = p_j2k->m_private_image->numcomps;
        opj_tcp_t *l_default_tile;
        opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,sizeof(opj_codestream_info_v2_t));
		if (!cstr_info)
			return NULL;

        cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

        cstr_info->tx0 = p_j2k->m_cp.tx0;
        cstr_info->ty0 = p_j2k->m_cp.ty0;
        cstr_info->tdx = p_j2k->m_cp.tdx;
        cstr_info->tdy = p_j2k->m_cp.tdy;
        cstr_info->tw = p_j2k->m_cp.tw;
        cstr_info->th = p_j2k->m_cp.th;

        cstr_info->tile_info = NULL; /* Not fill from the main header*/

        l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

        cstr_info->m_default_tile_info.csty = l_default_tile->csty;
        cstr_info->m_default_tile_info.prg = l_default_tile->prg;
        cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
        cstr_info->m_default_tile_info.mct = l_default_tile->mct;

        cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(cstr_info->nbcomps, sizeof(opj_tccp_info_t));
		if (!cstr_info->m_default_tile_info.tccp_info)
		{
			opj_destroy_cstr_info(&cstr_info);
			return NULL;
		}

        for (compno = 0; compno < numcomps; compno++) {
                opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
                opj_tccp_info_t *l_tccp_info = &(cstr_info->m_default_tile_info.tccp_info[compno]);
                OPJ_INT32 bandno, numbands;

                /* coding style*/
                l_tccp_info->csty = l_tccp->csty;
                l_tccp_info->numresolutions = l_tccp->numresolutions;
                l_tccp_info->cblkw = l_tccp->cblkw;
                l_tccp_info->cblkh = l_tccp->cblkh;
                l_tccp_info->cblksty = l_tccp->cblksty;
                l_tccp_info->qmfbid = l_tccp->qmfbid;
                if (l_tccp->numresolutions < OPJ_J2K_MAXRLVLS)
                {
                        memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
                        memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
                }

                /* quantization style*/
                l_tccp_info->qntsty = l_tccp->qntsty;
                l_tccp_info->numgbits = l_tccp->numgbits;

                numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
                if (numbands < OPJ_J2K_MAXBANDS) {
                        for (bandno = 0; bandno < numbands; bandno++) {
                                l_tccp_info->stepsizes_mant[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].mant;
                                l_tccp_info->stepsizes_expn[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].expn;
                        }
                }

                /* RGN value*/
                l_tccp_info->roishift = l_tccp->roishift;
        }

        return cstr_info;
}